

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_aggregate.cpp
# Opt level: O1

SinkCombineResultType __thiscall
duckdb::PhysicalHashAggregate::Combine
          (PhysicalHashAggregate *this,ExecutionContext *context,OperatorSinkCombineInput *input)

{
  GlobalSinkState *pGVar1;
  LocalSinkState *pLVar2;
  reference this_00;
  reference this_01;
  const_reference this_02;
  type gstate_p;
  type lstate_p;
  size_type __n;
  OperatorSinkCombineInput combine_distinct_input;
  OperatorSinkCombineInput local_48;
  
  pGVar1 = input->global_state;
  pLVar2 = input->local_state;
  local_48.interrupt_state = input->interrupt_state;
  local_48.global_state = pGVar1;
  local_48.local_state = pLVar2;
  CombineDistinct(this,context,&local_48);
  if (((((this->filter_indexes)._M_h._M_element_count != 0) ||
       ((this->grouped_aggregate_data).aggregates.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->grouped_aggregate_data).aggregates.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) ||
      ((this->non_distinct_filter).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (this->non_distinct_filter).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish)) &&
     ((this->groupings).
      super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
      .
      super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->groupings).
      super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
      .
      super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    __n = 0;
    do {
      this_00 = vector<duckdb::HashAggregateGroupingGlobalState,_true>::operator[]
                          ((vector<duckdb::HashAggregateGroupingGlobalState,_true> *)(pGVar1 + 1),
                           __n);
      this_01 = vector<duckdb::HashAggregateGroupingLocalState,_true>::operator[]
                          ((vector<duckdb::HashAggregateGroupingLocalState,_true> *)
                           &pLVar2[2].partition_info.min_batch_index,__n);
      this_02 = vector<duckdb::HashAggregateGroupingData,_true>::operator[](&this->groupings,__n);
      gstate_p = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                 ::operator*(&this_00->table_state);
      lstate_p = unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>
                 ::operator*(&this_01->table_state);
      RadixPartitionedHashTable::Combine(&this_02->table_data,context,gstate_p,lstate_p);
      __n = __n + 1;
    } while (__n < (ulong)(((long)(this->groupings).
                                  super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                  .
                                  super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->groupings).
                                  super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                  .
                                  super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4) *
                          0x6db6db6db6db6db7));
  }
  return FINISHED;
}

Assistant:

SinkCombineResultType PhysicalHashAggregate::Combine(ExecutionContext &context, OperatorSinkCombineInput &input) const {
	auto &gstate = input.global_state.Cast<HashAggregateGlobalSinkState>();
	auto &llstate = input.local_state.Cast<HashAggregateLocalSinkState>();

	OperatorSinkCombineInput combine_distinct_input {gstate, llstate, input.interrupt_state};
	CombineDistinct(context, combine_distinct_input);

	if (CanSkipRegularSink()) {
		return SinkCombineResultType::FINISHED;
	}
	for (idx_t i = 0; i < groupings.size(); i++) {
		auto &grouping_gstate = gstate.grouping_states[i];
		auto &grouping_lstate = llstate.grouping_states[i];

		auto &grouping = groupings[i];
		auto &table = grouping.table_data;
		table.Combine(context, *grouping_gstate.table_state, *grouping_lstate.table_state);
	}

	return SinkCombineResultType::FINISHED;
}